

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O2

void __thiscall Matrix<int>::transpose(Matrix<int> *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  ulong cols;
  pointer piVar4;
  size_type sVar5;
  size_type *psVar6;
  size_type sVar7;
  size_type sVar8;
  pointer piVar9;
  pointer piVar10;
  long lVar11;
  long lVar12;
  size_type i;
  ulong uVar13;
  size_type sVar14;
  undefined4 *puVar15;
  ulong uVar16;
  size_type sVar17;
  undefined1 auVar18 [16];
  Matrix<int> local_48;
  
  cols = *this->num_rows;
  if (cols == *this->num_cols) {
    lVar11 = 4;
    lVar12 = 0;
    uVar13 = 0;
    while (uVar13 != cols) {
      piVar4 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar5 = this->cols_;
      puVar15 = (undefined4 *)((long)piVar4 + lVar12 + sVar5 * lVar11);
      uVar13 = uVar13 + 1;
      for (uVar16 = uVar13; uVar16 < cols; uVar16 = uVar16 + 1) {
        uVar3 = *(undefined4 *)((long)piVar4 + uVar16 * 4 + sVar5 * lVar12);
        *(undefined4 *)((long)piVar4 + uVar16 * 4 + sVar5 * lVar12) = *puVar15;
        *puVar15 = uVar3;
        puVar15 = puVar15 + sVar5;
      }
      lVar12 = lVar12 + 4;
      lVar11 = lVar11 + 4;
    }
  }
  else {
    Matrix(&local_48,*this->num_cols,cols);
    psVar6 = this->num_cols;
    sVar5 = *this->num_rows;
    lVar11 = 0;
    for (sVar14 = 0; sVar14 != sVar5; sVar14 = sVar14 + 1) {
      sVar7 = *psVar6;
      puVar15 = (undefined4 *)
                ((long)local_48.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar11);
      sVar8 = this->cols_;
      piVar4 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar17 = 0; sVar7 != sVar17; sVar17 = sVar17 + 1) {
        *puVar15 = *(undefined4 *)((long)piVar4 + sVar17 * 4 + sVar8 * lVar11);
        puVar15 = puVar15 + local_48.cols_;
      }
      lVar11 = lVar11 + 4;
    }
    piVar4 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_48.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    piVar9 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar10 = (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_48.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_48.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_48.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = piVar9;
    local_48.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar10;
    local_48.data_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar4;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_48);
  }
  uVar1 = this->rows_;
  uVar2 = this->cols_;
  auVar18._8_4_ = (int)uVar1;
  auVar18._0_8_ = uVar2;
  auVar18._12_4_ = (int)((ulong)uVar1 >> 0x20);
  this->rows_ = uVar2;
  this->cols_ = auVar18._8_8_;
  return;
}

Assistant:

void transpose(){
    // if matrix is square, no extra memory is needed to build its transpose
    if (num_rows == num_cols){
      for (size_type i {0}; i < num_rows; i++){
        for (size_type j {i + 1}; j < num_cols; j++){
          std::swap(at(i, j), at(j, i));
        }
      }
    }
    // if matrix is not square, some extra memory is needed to build
    // its transpose
    else{
      // auxiliar memory to temporarily hold the transpose
      Matrix<Type> t {num_cols, num_rows};
      // builds transpose
      for (size_type i {0}; i < num_rows; i++){
        for (size_type j {0}; j < num_cols; j++){
          t.at(j, i) = at(i, j);
        }
      }
      // exchanges matrix data with t data, which is about to die
      std::swap(data_, t.data_);
    }
    // exchanges number of rows and columns
    std::swap(rows_, cols_);
  }